

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

HashUtil * __thiscall cfd::core::HashUtil::operator<<(HashUtil *this,Pubkey *pubkey)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  Pubkey::GetData((ByteData *)&local_30,pubkey);
  ByteData::Push(&this->buffer_,(ByteData *)&local_30);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  return this;
}

Assistant:

HashUtil &HashUtil::operator<<(const Pubkey &pubkey) {
  buffer_.Push(pubkey.GetData());
  return *this;
}